

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall xmrig::Network::getResults(Network *this,Value *reply,Document *doc,int version)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint32_t uVar1;
  long lVar2;
  Value results;
  Value best;
  Data local_c8;
  Data local_b8;
  Value *local_a0;
  Data local_98;
  Data local_88;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_b8.n = (Number)0x0;
  local_b8.s.str = (Ch *)0x3000000000000;
  local_40.s = "diff_current";
  local_40.length = 0xc;
  local_a0 = reply;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,&local_40,(this->m_state).diff,allocator);
  local_50.s = "shares_good";
  local_50.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,&local_50,(this->m_state).accepted,allocator);
  local_60.s = "shares_total";
  local_60.length = 0xc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,&local_60,(this->m_state).rejected + (this->m_state).accepted,allocator)
  ;
  uVar1 = NetworkState::avgTime(&this->m_state);
  local_98.s.str = (Ch *)0x40500000018fb72;
  local_98.n = (Number)0x8;
  local_c8._4_1_ = '\0';
  local_c8._5_1_ = '\0';
  local_c8._6_1_ = '\0';
  local_c8._7_1_ = '\0';
  local_c8._0_4_ = uVar1;
  local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
  local_70.s = "hashes_total";
  local_70.length = 0xc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,&local_70,(this->m_state).total,allocator);
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x4000000000000;
  lVar2 = -0x50;
  do {
    local_c8.n = (Number)((Number *)((long)(&(this->m_state).topDiff + 1) + lVar2))->i64;
    local_c8.s.str =
         (Ch *)((ulong)(ushort)((ushort)(((ulong)local_c8.n & 0xffffffff80000000) == 0) * 0x20 +
                                ((ushort)((ulong)local_c8.n >> 0x20 == 0) << 6 |
                                (ushort)(-1 < (long)local_c8.n) << 7) + 0x116) << 0x30);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,allocator);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0);
  local_c8.s.str = (Ch *)0x40500000018fb88;
  local_c8.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,allocator);
  if (version == 1) {
    local_88.n.i64 = (Number)0x0;
    local_88.s.str = (Ch *)0x4000000000000;
    local_c8.s.str = (Ch *)0x40500000018fb42;
    local_c8.n = (Number)0x9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,allocator);
  }
  local_c8.s.str = (Ch *)0x40500000018fb8d;
  local_c8.n = (Number)0x7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_a0,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,allocator);
  return;
}

Assistant:

void xmrig::Network::getResults(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value results(kObjectType);

    results.AddMember("diff_current",  m_state.diff, allocator);
    results.AddMember("shares_good",   m_state.accepted, allocator);
    results.AddMember("shares_total",  m_state.accepted + m_state.rejected, allocator);
    results.AddMember("avg_time",      m_state.avgTime(), allocator);
    results.AddMember("hashes_total",  m_state.total, allocator);

    Value best(kArrayType);
    for (uint64_t i : m_state.topDiff) {
        best.PushBack(i, allocator);
    }

    results.AddMember("best", best, allocator);

    if (version == 1) {
        results.AddMember("error_log", Value(kArrayType), allocator);
    }

    reply.AddMember("results", results, allocator);
}